

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaParser::uri_load(XMLElement *xml)

{
  undefined8 uVar1;
  char *pcVar2;
  mapped_type *ppXVar3;
  XMLElement *local_50;
  XMLElement *child;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string id;
  XMLElement *xml_local;
  
  id.field_2._8_8_ = xml;
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = tinyxml2::XMLElement::Attribute((XMLElement *)id.field_2._8_8_,"id",(char *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_30,pcVar2,&local_31);
    std::allocator<char>::~allocator(&local_31);
    uVar1 = id.field_2._8_8_;
    ppXVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*>_>_>
                            *)sources_abi_cxx11_,(key_type *)local_30);
    *ppXVar3 = (mapped_type)uVar1;
    std::__cxx11::string::~string((string *)local_30);
  }
  for (local_50 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)id.field_2._8_8_,(char *)0x0);
      local_50 != (XMLElement *)0x0;
      local_50 = tinyxml2::XMLNode::NextSiblingElement(&local_50->super_XMLNode,(char *)0x0)) {
    uri_load(local_50);
  }
  return;
}

Assistant:

void ColladaParser::uri_load( XMLElement* xml ) {

  if (xml->Attribute("id")) {
    string id = xml->Attribute("id");
    sources[id] = xml;
  }

  XMLElement* child = xml->FirstChildElement();
  while (child) {
    uri_load(child);
    child = child->NextSiblingElement();
  }

}